

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_hmac_starts(mbedtls_md_context_t *ctx,uchar *key,size_t keylen)

{
  uchar *input;
  void *__s;
  ulong local_90;
  size_t i;
  uchar *opad;
  uchar *ipad;
  uchar sum [64];
  int local_2c;
  size_t sStack_28;
  int ret;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_md_context_t *ctx_local;
  
  if (((ctx == (mbedtls_md_context_t *)0x0) || (ctx->md_info == (mbedtls_md_info_t *)0x0)) ||
     (ctx->hmac_ctx == (void *)0x0)) {
    return -0x5100;
  }
  sStack_28 = keylen;
  keylen_local = (size_t)key;
  if (ctx->md_info->block_size < keylen) {
    local_2c = mbedtls_md_starts(ctx);
    if (((local_2c != 0) || (local_2c = mbedtls_md_update(ctx,key,keylen), local_2c != 0)) ||
       (local_2c = mbedtls_md_finish(ctx,(uchar *)&ipad), local_2c != 0)) goto LAB_0010f456;
    sStack_28 = (size_t)ctx->md_info->size;
    keylen_local = (size_t)&ipad;
  }
  input = (uchar *)ctx->hmac_ctx;
  __s = (void *)((long)ctx->hmac_ctx + (long)(int)(uint)ctx->md_info->block_size);
  memset(input,0x36,(ulong)ctx->md_info->block_size);
  memset(__s,0x5c,(ulong)ctx->md_info->block_size);
  for (local_90 = 0; local_90 < sStack_28; local_90 = local_90 + 1) {
    input[local_90] = input[local_90] ^ *(byte *)(keylen_local + local_90);
    *(byte *)((long)__s + local_90) =
         *(byte *)((long)__s + local_90) ^ *(byte *)(keylen_local + local_90);
  }
  local_2c = mbedtls_md_starts(ctx);
  if (local_2c == 0) {
    local_2c = mbedtls_md_update(ctx,input,(ulong)ctx->md_info->block_size);
  }
LAB_0010f456:
  mbedtls_platform_zeroize(&ipad,0x40);
  return local_2c;
}

Assistant:

int mbedtls_md_hmac_starts( mbedtls_md_context_t *ctx, const unsigned char *key, size_t keylen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char sum[MBEDTLS_MD_MAX_SIZE];
    unsigned char *ipad, *opad;
    size_t i;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( keylen > (size_t) ctx->md_info->block_size )
    {
        if( ( ret = mbedtls_md_starts( ctx ) ) != 0 )
            goto cleanup;
        if( ( ret = mbedtls_md_update( ctx, key, keylen ) ) != 0 )
            goto cleanup;
        if( ( ret = mbedtls_md_finish( ctx, sum ) ) != 0 )
            goto cleanup;

        keylen = ctx->md_info->size;
        key = sum;
    }

    ipad = (unsigned char *) ctx->hmac_ctx;
    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    memset( ipad, 0x36, ctx->md_info->block_size );
    memset( opad, 0x5C, ctx->md_info->block_size );

    for( i = 0; i < keylen; i++ )
    {
        ipad[i] = (unsigned char)( ipad[i] ^ key[i] );
        opad[i] = (unsigned char)( opad[i] ^ key[i] );
    }

    if( ( ret = mbedtls_md_starts( ctx ) ) != 0 )
        goto cleanup;
    if( ( ret = mbedtls_md_update( ctx, ipad,
                                   ctx->md_info->block_size ) ) != 0 )
        goto cleanup;

cleanup:
    mbedtls_platform_zeroize( sum, sizeof( sum ) );

    return( ret );
}